

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void print_escape(flatcc_json_printer_t *ctx,uchar c)

{
  char *pcVar1;
  undefined3 in_register_00000031;
  int iVar2;
  char cVar3;
  
  iVar2 = CONCAT31(in_register_00000031,c);
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\\';
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  switch(iVar2) {
  case 8:
    *pcVar1 = 'b';
    return;
  case 9:
    *pcVar1 = 't';
    return;
  case 10:
    *pcVar1 = 'n';
    return;
  case 0xb:
    goto switchD_00125978_caseD_b;
  case 0xc:
    *pcVar1 = 'f';
    return;
  case 0xd:
    *pcVar1 = 'r';
    return;
  default:
    if (iVar2 == 0x5c) {
      *pcVar1 = '\\';
      return;
    }
    if (iVar2 == 0x22) {
      *pcVar1 = '\"';
      return;
    }
switchD_00125978_caseD_b:
    *pcVar1 = 'u';
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '0';
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = '0';
    cVar3 = 'W';
    if (c < 0xa0) {
      cVar3 = '0';
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = cVar3 + (c >> 4);
    cVar3 = 'W';
    if ((c & 0xf) < 10) {
      cVar3 = '0';
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = cVar3 + (c & 0xf);
    return;
  }
}

Assistant:

static void print_escape(flatcc_json_printer_t *ctx, unsigned char c)
{
    unsigned char x;

    print_char('\\');
    switch (c) {
    case '"': print_char('\"'); break;
    case '\\': print_char('\\'); break;
    case '\t' : print_char('t'); break;
    case '\f' : print_char('f'); break;
    case '\r' : print_char('r'); break;
    case '\n' : print_char('n'); break;
    case '\b' : print_char('b'); break;
    default:
        print_char('u');
        print_char('0');
        print_char('0');
        x = c >> 4;
        x += x < 10 ? '0' : 'a' - 10;
        print_char((char)x);
        x = c & 15;
        x += x < 10 ? '0' : 'a' - 10;
        print_char((char)x);
        break;
    }
}